

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

void __thiscall
QItemSelectionModelPrivate::initModel(QItemSelectionModelPrivate *this,QAbstractItemModel *m)

{
  QAbstractItemModel *pQVar1;
  QObject *pQVar2;
  ConnectionType type;
  long in_FS_OFFSET;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
  if (pQVar1 != m) {
    pQVar2 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
    if (pQVar1 != (QAbstractItemModel *)0x0) {
      (*pQVar2->_vptr_QObject[0x10])(pQVar2);
      disconnectModel(this);
    }
    (this->model).super_QPropertyData<QAbstractItemModel_*>.val = m;
    if (m != (QAbstractItemModel *)0x0) {
      type = (ConnectionType)this;
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QItemSelectionModelPrivate::*)(QModelIndex_const&,int,int)>
                ((Object *)local_98,(offset_in_QAbstractItemModel_to_subr)m,
                 (Object *)QAbstractItemModel::rowsAboutToBeRemoved,0,type);
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QItemSelectionModelPrivate::*)(QModelIndex_const&,int,int)>
                ((Object *)(local_98 + 8),(offset_in_QAbstractItemModel_to_subr)m,
                 (Object *)QAbstractItemModel::columnsAboutToBeRemoved,0,type);
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QItemSelectionModelPrivate::*)(QModelIndex_const&,int,int)>
                ((Object *)local_88,(offset_in_QAbstractItemModel_to_subr)m,
                 (Object *)QAbstractItemModel::rowsAboutToBeInserted,0,type);
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QItemSelectionModelPrivate::*)(QModelIndex_const&,int,int)>
                ((Object *)(local_88 + 8),(offset_in_QAbstractItemModel_to_subr)m,
                 (Object *)QAbstractItemModel::columnsAboutToBeInserted,0,type);
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QItemSelectionModelPrivate::*)()>
                ((Object *)local_78,(offset_in_QAbstractItemModel_to_subr)m,
                 (Object *)QAbstractItemModel::rowsAboutToBeMoved,0,type);
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QItemSelectionModelPrivate::*)()>
                ((Object *)(local_78 + 8),(offset_in_QAbstractItemModel_to_subr)m,
                 (Object *)QAbstractItemModel::columnsAboutToBeMoved,0,type);
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QItemSelectionModelPrivate::*)()>
                ((Object *)local_68,(offset_in_QAbstractItemModel_to_subr)m,
                 (Object *)QAbstractItemModel::rowsMoved,0,type);
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QItemSelectionModelPrivate::*)()>
                ((Object *)(local_68 + 8),(offset_in_QAbstractItemModel_to_subr)m,
                 (Object *)QAbstractItemModel::columnsMoved,0,type);
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),void(QItemSelectionModelPrivate::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint)>
                ((Object *)local_58,(offset_in_QAbstractItemModel_to_subr)m,
                 (Object *)QAbstractItemModel::layoutAboutToBeChanged,0,type);
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),void(QItemSelectionModelPrivate::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint)>
                ((Object *)(local_58 + 8),(offset_in_QAbstractItemModel_to_subr)m,
                 (Object *)QAbstractItemModel::layoutChanged,0,type);
      QObject::
      connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QItemSelectionModel::*)()>
                ((Object *)local_48,(offset_in_QAbstractItemModel_to_subr)m,
                 (ContextType *)QAbstractItemModel::modelReset,
                 (offset_in_QItemSelectionModel_to_subr *)0x0,(ConnectionType)pQVar2);
      QObjectPrivate::connect<void(QObject::*)(QObject*),void(QItemSelectionModelPrivate::*)()>
                ((Object *)(local_48 + 8),(offset_in_QObject_to_subr)m,(Object *)QObject::destroyed,
                 0,type);
      std::array<QMetaObject::Connection,_12UL>::operator=
                (&this->connections,(array<QMetaObject::Connection,_12UL> *)local_98);
      std::array<QMetaObject::Connection,_12UL>::~array
                ((array<QMetaObject::Connection,_12UL> *)local_98);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemSelectionModelPrivate::initModel(QAbstractItemModel *m)
{
    Q_Q(QItemSelectionModel);
    const QAbstractItemModel *oldModel = model.valueBypassingBindings();
    if (oldModel == m)
        return;

    if (oldModel) {
        q->reset();
        disconnectModel();
    }

    // Caller has to call notify(), unless calling during construction (the common case).
    model.setValueBypassingBindings(m);

    if (m) {
        connections = std::array<QMetaObject::Connection, 12> {
            QObjectPrivate::connect(m, &QAbstractItemModel::rowsAboutToBeRemoved,
                                    this, &QItemSelectionModelPrivate::rowsAboutToBeRemoved),
            QObjectPrivate::connect(m, &QAbstractItemModel::columnsAboutToBeRemoved,
                                    this, &QItemSelectionModelPrivate::columnsAboutToBeRemoved),
            QObjectPrivate::connect(m, &QAbstractItemModel::rowsAboutToBeInserted,
                                    this, &QItemSelectionModelPrivate::rowsAboutToBeInserted),
            QObjectPrivate::connect(m, &QAbstractItemModel::columnsAboutToBeInserted,
                                    this, &QItemSelectionModelPrivate::columnsAboutToBeInserted),
            QObjectPrivate::connect(m, &QAbstractItemModel::rowsAboutToBeMoved,
                                    this, &QItemSelectionModelPrivate::triggerLayoutToBeChanged),
            QObjectPrivate::connect(m, &QAbstractItemModel::columnsAboutToBeMoved,
                                    this, &QItemSelectionModelPrivate::triggerLayoutToBeChanged),
            QObjectPrivate::connect(m, &QAbstractItemModel::rowsMoved,
                                    this, &QItemSelectionModelPrivate::triggerLayoutChanged),
            QObjectPrivate::connect(m, &QAbstractItemModel::columnsMoved,
                                    this, &QItemSelectionModelPrivate::triggerLayoutChanged),
            QObjectPrivate::connect(m, &QAbstractItemModel::layoutAboutToBeChanged,
                                    this, &QItemSelectionModelPrivate::layoutAboutToBeChanged),
            QObjectPrivate::connect(m, &QAbstractItemModel::layoutChanged,
                                    this, &QItemSelectionModelPrivate::layoutChanged),
            QObject::connect(m, &QAbstractItemModel::modelReset,
                             q, &QItemSelectionModel::reset),
            QObjectPrivate::connect(m, &QAbstractItemModel::destroyed,
                                    this, &QItemSelectionModelPrivate::modelDestroyed)
        };
    }
}